

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexCache.cpp
# Opt level: O0

void __thiscall Ptex::v2_2::PtexReaderCache::pruneFiles(PtexReaderCache *this)

{
  bool bVar1;
  PtexCachedReader *pPVar2;
  PtexLruList<Ptex::v2_2::PtexCachedReader,_&Ptex::v2_2::PtexCachedReader::_openFilesItem> *in_RDI;
  PtexCachedReader *reader;
  size_t numToClose;
  PtexReader *in_stack_ffffffffffffffd8;
  long local_10;
  
  local_10 = (long)in_RDI[0xd]._end._prev - (long)(in_RDI->_end)._next;
  if (local_10 != 0) {
    while (local_10 != 0) {
      pPVar2 = PtexLruList<Ptex::v2_2::PtexCachedReader,_&Ptex::v2_2::PtexCachedReader::_openFilesItem>
               ::pop(in_RDI);
      if (pPVar2 == (PtexCachedReader *)0x0) {
        in_RDI[0xd]._end._prev = (PtexLruItem *)0x0;
        return;
      }
      bVar1 = PtexReader::tryClose(in_stack_ffffffffffffffd8);
      if (bVar1) {
        local_10 = local_10 + -1;
        in_RDI[0xd]._end._prev = (PtexLruItem *)((long)&in_RDI[0xd]._end._prev[-1]._next + 7);
      }
    }
  }
  return;
}

Assistant:

void PtexReaderCache::pruneFiles()
{
    size_t numToClose = _filesOpen - _maxFiles;
    if (numToClose > 0) {
        while (numToClose) {
            PtexCachedReader* reader = _openFiles.pop();
            if (!reader) { _filesOpen = 0; break; }
            if (reader->tryClose()) {
                --numToClose;
                --_filesOpen;
            }
        }
    }
}